

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_semaphore_release__posix(ma_semaphore *pSemaphore)

{
  ma_semaphore *pSemaphore_local;
  
  if (pSemaphore == (ma_semaphore *)0x0) {
    pSemaphore_local._4_4_ = -2;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&pSemaphore->lock);
    pSemaphore->value = pSemaphore->value + 1;
    pthread_cond_signal((pthread_cond_t *)&pSemaphore->cond);
    pthread_mutex_unlock((pthread_mutex_t *)&pSemaphore->lock);
    pSemaphore_local._4_4_ = 0;
  }
  return pSemaphore_local._4_4_;
}

Assistant:

static ma_result ma_semaphore_release__posix(ma_semaphore* pSemaphore)
{
    if (pSemaphore == NULL) {
        return MA_INVALID_ARGS;
    }

    pthread_mutex_lock(&pSemaphore->lock);
    {
        pSemaphore->value += 1;
        pthread_cond_signal(&pSemaphore->cond);
    }
    pthread_mutex_unlock(&pSemaphore->lock);

    return MA_SUCCESS;
}